

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O3

ConstantValue * __thiscall
slang::ConstantValue::convertToByteQueue
          (ConstantValue *__return_storage_ptr__,ConstantValue *this,bool isSigned)

{
  __index_type _Var1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar2;
  size_type sVar3;
  undefined1 *puVar4;
  long lVar5;
  variant_alternative_t<6UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  string result;
  SVQueue queue;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_d0;
  undefined8 local_c8;
  size_type local_c0;
  undefined8 uStack_b8;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *local_90;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  _Var1 = *(__index_type *)
           ((long)&(this->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x20);
  if (_Var1 == '\b') {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)__return_storage_ptr__,
                      (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)this);
  }
  else {
    local_b0 = &local_a0;
    local_a8 = 0;
    local_a0 = 0;
    if (_Var1 == '\x06') {
      std::
      get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                (&this->value);
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    else {
      if (_Var1 != '\x01') {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->value).
                 super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         + 0x20) = '\0';
        return __return_storage_ptr__;
      }
      convertToStr((ConstantValue *)&local_88,this);
      pvVar6 = std::
               get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_88);
      local_d0.pVal = (uint64_t *)(pvVar6->_M_dataplus)._M_p;
      paVar7 = &pvVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.val == paVar7) {
        local_c0 = paVar7->_M_allocated_capacity;
        uStack_b8 = *(undefined8 *)((long)&pvVar6->field_2 + 8);
        local_d0.pVal = &local_c0;
      }
      else {
        local_c0 = paVar7->_M_allocated_capacity;
      }
      local_c8 = pvVar6->_M_string_length;
      (pvVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pvVar6->_M_string_length = 0;
      (pvVar6->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
      if ((size_type *)local_d0.val != &local_c0) {
        operator_delete(local_d0.pVal,local_c0 + 1);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_88);
    }
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_88._16_8_ = 0;
    local_88._24_8_ = 0;
    local_88._0_8_ = 0;
    local_88._8_8_ = 0;
    local_90 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)__return_storage_ptr__;
    std::_Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::_M_initialize_map
              ((_Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_88
               ,0);
    lVar5 = local_a8;
    puVar4 = local_b0;
    local_38 = 0;
    if (local_a8 != 0) {
      lVar8 = 0;
      do {
        sVar3 = local_c8;
        local_d0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)(char)puVar4[lVar8];
        local_c8._6_2_ = SUB82(sVar3,6);
        local_c8._0_6_ = (uint6)CONCAT14(isSigned,8);
        SVInt::clearUnusedBits((SVInt *)&local_d0);
        std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
        emplace_back<slang::SVInt>
                  ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_88,
                   (SVInt *)&local_d0);
        if (((0x40 < (uint)local_c8) || ((local_c8 & 0x10000000000) != 0)) &&
           ((size_type *)local_d0.val != (size_type *)0x0)) {
          operator_delete__(local_d0.pVal);
        }
        lVar8 = lVar8 + 1;
      } while (lVar5 != lVar8);
    }
    CopyPtr<slang::SVQueue>::CopyPtr<slang::SVQueue,void>
              ((CopyPtr<slang::SVQueue> *)&local_d0,(SVQueue *)&local_88);
    __return_storage_ptr__ = (ConstantValue *)local_90;
    aVar2 = local_d0;
    local_d0.val = 0;
    *local_90 = aVar2;
    *(__index_type *)(local_90 + 4) = '\b';
    CopyPtr<slang::SVQueue>::~CopyPtr((CopyPtr<slang::SVQueue> *)&local_d0);
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_88);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
    }
  }
  return (ConstantValue *)(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)__return_storage_ptr__;
}

Assistant:

ConstantValue ConstantValue::convertToByteQueue(bool isSigned) const {
    if (isQueue())
        return *this;

    std::string result;
    if (isInteger())
        result = convertToStr().str();
    else if (isString())
        result = str();
    else
        return nullptr;

    SVQueue queue;
    for (auto ch : result)
        queue.emplace_back(SVInt(8, static_cast<uint64_t>(ch), isSigned));

    return queue;
}